

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O2

Rect * __thiscall
RTree<int,_double,_2,_double,_8,_4>::CombineRect
          (Rect *__return_storage_ptr__,RTree<int,_double,_2,_double,_8,_4> *this,Rect *a_rectA,
          Rect *a_rectB)

{
  int index;
  long lVar1;
  double dVar2;
  
  if ((a_rectA != (Rect *)0x0) && (a_rectB != (Rect *)0x0)) {
    for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
      dVar2 = a_rectB->m_min[lVar1];
      if (a_rectA->m_min[lVar1] <= a_rectB->m_min[lVar1]) {
        dVar2 = a_rectA->m_min[lVar1];
      }
      __return_storage_ptr__->m_min[lVar1] = dVar2;
      dVar2 = a_rectB->m_max[lVar1];
      if (a_rectB->m_max[lVar1] <= a_rectA->m_max[lVar1]) {
        dVar2 = a_rectA->m_max[lVar1];
      }
      __return_storage_ptr__->m_max[lVar1] = dVar2;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("a_rectA && a_rectB",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                ,0x476,
                "typename RTree<DATATYPE, ELEMTYPE, NUMDIMS, ELEMTYPEREAL, TMAXNODES, TMINNODES>::Rect RTree<int, double, 2>::CombineRect(const Rect *, const Rect *) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
               );
}

Assistant:

RTREE_TEMPLATE
typename RTREE_QUAL::Rect RTREE_QUAL::CombineRect(const Rect* a_rectA, const Rect* a_rectB)
{
  ASSERT(a_rectA && a_rectB);

  Rect newRect;

  for(int index = 0; index < NUMDIMS; ++index)
  {
    newRect.m_min[index] = Min(a_rectA->m_min[index], a_rectB->m_min[index]);
    newRect.m_max[index] = Max(a_rectA->m_max[index], a_rectB->m_max[index]);
  }

  return newRect;
}